

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O2

Span * __thiscall tcmalloc::PageHeap::SearchFreeAndLargeLists(PageHeap *this,Length n)

{
  bool bVar1;
  Span *pSVar2;
  Length LVar3;
  Span *span;
  
  pSVar2 = (Span *)(Static::pageheap_ + (long)((this->pagemap_cache_).array_ + n * 0xc + 0x2d12));
  LVar3 = n;
  while( true ) {
    if (0x80 < LVar3) {
      pSVar2 = AllocLarge(this,n);
      return pSVar2;
    }
    span = pSVar2->next;
    if (pSVar2 != span) break;
    if (pSVar2 + 1 != pSVar2[1].next) {
      bVar1 = EnsureLimit(this,n,true);
      if ((bVar1) && (span = pSVar2[1].next, pSVar2 + 1 != span)) break;
    }
    LVar3 = LVar3 + 1;
    pSVar2 = pSVar2 + 2;
  }
  Carve(this,span,n);
  return span;
}

Assistant:

Span* PageHeap::SearchFreeAndLargeLists(Length n) {
  ASSERT(lock_.IsHeld());
  ASSERT(Check());
  ASSERT(n > 0);

  // Find first size >= n that has a non-empty list
  for (Length s = n; s <= kMaxPages; s++) {
    Span* ll = &free_[s - 1].normal;
    // If we're lucky, ll is non-empty, meaning it has a suitable span.
    if (!DLL_IsEmpty(ll)) {
      ASSERT(ll->next->location == Span::ON_NORMAL_FREELIST);
      return Carve(ll->next, n);
    }
    // Alternatively, maybe there's a usable returned span.
    ll = &free_[s - 1].returned;
    if (!DLL_IsEmpty(ll)) {
      // We did not call EnsureLimit before, to avoid releasing the span
      // that will be taken immediately back.
      // Calling EnsureLimit here is not very expensive, as it fails only if
      // there is no more normal spans (and it fails efficiently)
      // or SystemRelease does not work (there is probably no returned spans).
      if (EnsureLimit(n)) {
        // ll may have became empty due to coalescing
        if (!DLL_IsEmpty(ll)) {
          ASSERT(ll->next->location == Span::ON_RETURNED_FREELIST);
          return Carve(ll->next, n);
        }
      }
    }
  }
  // No luck in free lists, our last chance is in a larger class.
  return AllocLarge(n);  // May be nullptr
}